

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serve_dynamic_content.hpp
# Opt level: O0

bool pstore::http::details::starts_with(string *s,string *prefix)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  bool bVar4;
  undefined8 local_20;
  size_type pos;
  string *prefix_local;
  string *s_local;
  
  local_20 = 0;
  while( true ) {
    uVar2 = std::__cxx11::string::length();
    bVar4 = false;
    if (local_20 < uVar2) {
      uVar2 = std::__cxx11::string::length();
      bVar4 = false;
      if (local_20 < uVar2) {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
        cVar1 = *pcVar3;
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)prefix);
        bVar4 = cVar1 == *pcVar3;
      }
    }
    if (!bVar4) break;
    local_20 = local_20 + 1;
  }
  uVar2 = std::__cxx11::string::length();
  return local_20 == uVar2;
}

Assistant:

inline bool starts_with (std::string const & s, std::string const & prefix) {
                std::string::size_type pos = 0;
                while (pos < s.length () && pos < prefix.length () && s[pos] == prefix[pos]) {
                    ++pos;
                }
                return pos == prefix.length ();
            }